

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderInterfaceCompatibility.cpp
# Opt level: O2

void __thiscall
Rml::RenderInterfaceAdapter::RenderToClipMask
          (RenderInterfaceAdapter *this,ClipMaskOperation operation,CompiledGeometryHandle handle,
          Vector2f translation)

{
  Vector2Type *pVVar1;
  const_iterator __begin1;
  Vector2Type *pVVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Rectangle<int> RVar3;
  Rectanglef rectangle;
  Rectangle<float> local_58;
  undefined1 local_48 [16];
  Rectangle<float> local_30;
  
  if (operation != SetInverse) {
    local_48._8_4_ = in_XMM0_Dc;
    local_48._0_8_ = translation;
    local_48._12_4_ = in_XMM0_Dd;
    pVVar2 = *(Vector2Type **)handle;
    local_58.p1.x = pVVar2->x;
    local_58.p0 = *pVVar2;
    local_58.p1.y = pVVar2->y;
    pVVar1 = *(Vector2Type **)(handle + 8);
    for (; pVVar2 != pVVar1; pVVar2 = (Vector2Type *)&pVVar2[2].y) {
      local_58 = Rectangle<float>::Join(&local_58,*pVVar2);
    }
    local_30 = Rectangle<float>::Translate(&local_58,(Vector2Type)local_48._0_8_);
    RVar3 = Rectangle::operator_cast_to_Rectangle(&local_30);
    (*this->legacy->_vptr_RenderInterfaceCompatibility[7])
              (this->legacy,(ulong)RVar3.p0.x,(ulong)RVar3.p0 >> 0x20,
               (ulong)(RVar3.p1.x - RVar3.p0.x),(ulong)(uint)(RVar3.p1.y - RVar3.p0.y));
  }
  return;
}

Assistant:

void RenderInterfaceAdapter::RenderToClipMask(ClipMaskOperation operation, CompiledGeometryHandle handle, Vector2f translation)
{
	switch (operation)
	{
	case ClipMaskOperation::Set:
	case ClipMaskOperation::Intersect:
		// Intersect is considered like Set. This typically occurs in nested clipping situations, which never worked
		// correctly in legacy.
		break;
	case ClipMaskOperation::SetInverse:
		// Using features not supported in legacy, bail out.
		return;
	}

	// New features can render more complex clip masks, while legacy only supported rectangle scissoring. Find the
	// geometry's rectangular coverage.
	const AdaptedGeometry* geometry = reinterpret_cast<AdaptedGeometry*>(handle);

	Rectanglef rectangle = Rectanglef::FromPosition(geometry->vertices[0].position);
	for (const Vertex& vertex : geometry->vertices)
		rectangle = rectangle.Join(vertex.position);

	const Rectanglei scissor = Rectanglei(rectangle.Translate(translation));
	legacy.SetScissorRegion(scissor.Left(), scissor.Top(), scissor.Width(), scissor.Height());
}